

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall Memory::LargeHeapBlock::DisposeObjects(LargeHeapBlock *this,Recycler *recycler)

{
  size_t *psVar1;
  undefined4 *puVar2;
  code *pcVar3;
  uchar uVar4;
  bool bVar5;
  uint uVar6;
  HeapInfo *pHVar7;
  LargeObjectHeader *pLVar8;
  LargeObjectHeader *this_00;
  undefined8 *in_FS_OFFSET;
  
  this_00 = this->pendingDisposeObject;
  if (this_00 == (LargeObjectHeader *)0x0) {
    if (this->hasDisposeBeenCalled != false) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x806,
                       "(this->pendingDisposeObject != nullptr || this->hasDisposeBeenCalled)",
                       "this->pendingDisposeObject != nullptr || this->hasDisposeBeenCalled");
    if (!bVar5) {
LAB_002488c5:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
    this_00 = this->pendingDisposeObject;
    if (this_00 == (LargeObjectHeader *)0x0) {
      return;
    }
  }
  puVar2 = (undefined4 *)*in_FS_OFFSET;
  pHVar7 = this->heapInfo;
  do {
    this->hasDisposeBeenCalled = true;
    pLVar8 = LargeObjectHeader::GetNext(this_00,pHVar7->recycler->Cookie);
    this->pendingDisposeObject = pLVar8;
    uVar4 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie);
    if (-1 < (char)uVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar2 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x810,
                         "(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit)",
                         "header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit");
      if (!bVar5) goto LAB_002488c5;
      *puVar2 = 0;
    }
    if ((&this[1].super_HeapBlock._vptr_HeapBlock)[this_00->objectIndex] != (_func_int **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar2 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x811,"(this->HeaderList()[header->objectIndex] == nullptr)",
                         "this->HeaderList()[header->objectIndex] == nullptr");
      if (!bVar5) goto LAB_002488c5;
      *puVar2 = 0;
    }
    (**(code **)(*(long *)(this_00 + 1) + 8))(this_00 + 1,0);
    uVar6 = this->finalizeCount;
    if (uVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar2 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x816,"(finalizeCount != 0)","finalizeCount != 0");
      if (!bVar5) goto LAB_002488c5;
      *puVar2 = 0;
      uVar6 = this->finalizeCount;
    }
    this->finalizeCount = uVar6 - 1;
    if ((this->bucket->supportFreeList != true) ||
       (bVar5 = TrimObject(this,recycler,this_00,this_00->objectSize,true), !bVar5)) {
      FillFreeMemory(this,recycler,this_00,this_00->objectSize + 0x20);
    }
    psVar1 = &(recycler->collectionStats).finalizeSweepCount;
    *psVar1 = *psVar1 + 1;
    pHVar7 = this->heapInfo;
    pHVar7->liveFinalizableObjectCount = pHVar7->liveFinalizableObjectCount - 1;
    pHVar7->pendingDisposableObjectCount = pHVar7->pendingDisposableObjectCount - 1;
    this_00 = this->pendingDisposeObject;
    if (this_00 == (LargeObjectHeader *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void
LargeHeapBlock::DisposeObjects(Recycler * recycler)
{
    Assert(this->pendingDisposeObject != nullptr || this->hasDisposeBeenCalled);

    while (pendingDisposeObject != nullptr)
    {
#if DBG
        this->hasDisposeBeenCalled = true;
#endif

        LargeObjectHeader * header = pendingDisposeObject;
        pendingDisposeObject = header->GetNext(this->heapInfo->recycler->Cookie);
        Assert(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit);
        Assert(this->HeaderList()[header->objectIndex] == nullptr);

        void * objectAddress = header->GetAddress();
        ((FinalizableObject *)objectAddress)->Dispose(false);

        Assert(finalizeCount != 0);
        finalizeCount--;

        bool objectTrimmed = false;

        if (this->bucket->SupportFreeList())
        {
            objectTrimmed = TrimObject(recycler, header, header->objectSize, true /* need suspend */);
        }

        // GCTODO: Consider free listing items after Dispose too
        // GCTODO: Consider compacting heap blocks- if the last n items are free, move the address pointer
        // back to before the nth item so we can bump allocate from this heap block
        if (!objectTrimmed)
        {
            FillFreeMemory(recycler, header, sizeof(LargeObjectHeader) + header->objectSize);
        }

        RECYCLER_STATS_INC(recycler, finalizeSweepCount);
#ifdef RECYCLER_FINALIZE_CHECK
        this->heapInfo->liveFinalizableObjectCount--;
        this->heapInfo->pendingDisposableObjectCount--;
#endif
    }
}